

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  InternalMetadataWithArena *this_00;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  string *psVar6;
  void **ppvVar7;
  FileOptions *pFVar8;
  SourceCodeInfo *pSVar9;
  int iVar10;
  Arena *pAVar11;
  
  this_00 = &this->_internal_metadata_;
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  iVar10 = (from->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    pRVar4 = (from->dependency_).super_RepeatedPtrFieldBase.rep_;
    ppvVar7 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->dependency_).super_RepeatedPtrFieldBase,iVar10);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->dependency_).super_RepeatedPtrFieldBase,ppvVar7,pRVar4->elements,iVar10,
               ((this->dependency_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
    iVar10 = iVar10 + (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
    (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
    pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar10) {
      pRVar4->allocated_size = iVar10;
    }
  }
  iVar10 = (from->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    pRVar4 = (from->message_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar7 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->message_type_).super_RepeatedPtrFieldBase,iVar10);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
              (&(this->message_type_).super_RepeatedPtrFieldBase,ppvVar7,pRVar4->elements,iVar10,
               ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar10 = iVar10 + (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
    pRVar4 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar10) {
      pRVar4->allocated_size = iVar10;
    }
  }
  iVar10 = (from->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    pRVar4 = (from->enum_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar7 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar10);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
              (&(this->enum_type_).super_RepeatedPtrFieldBase,ppvVar7,pRVar4->elements,iVar10,
               ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar10 = iVar10 + (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
    pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar10) {
      pRVar4->allocated_size = iVar10;
    }
  }
  iVar10 = (from->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    pRVar4 = (from->service_).super_RepeatedPtrFieldBase.rep_;
    ppvVar7 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->service_).super_RepeatedPtrFieldBase,iVar10);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
              (&(this->service_).super_RepeatedPtrFieldBase,ppvVar7,pRVar4->elements,iVar10,
               ((this->service_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->service_).super_RepeatedPtrFieldBase.current_size_);
    iVar10 = iVar10 + (this->service_).super_RepeatedPtrFieldBase.current_size_;
    (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
    pRVar4 = (this->service_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar10) {
      pRVar4->allocated_size = iVar10;
    }
  }
  iVar10 = (from->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 != 0) {
    pRVar4 = (from->extension_).super_RepeatedPtrFieldBase.rep_;
    ppvVar7 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar10);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->extension_).super_RepeatedPtrFieldBase,ppvVar7,pRVar4->elements,iVar10,
               ((this->extension_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_).super_RepeatedPtrFieldBase.current_size_);
    iVar10 = iVar10 + (this->extension_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar10;
    pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar10) {
      pRVar4->allocated_size = iVar10;
    }
  }
  iVar10 = (from->public_dependency_).current_size_;
  if (iVar10 != 0) {
    iVar1 = (this->public_dependency_).current_size_;
    RepeatedField<int>::Reserve(&this->public_dependency_,iVar10 + iVar1);
    (this->public_dependency_).current_size_ =
         (this->public_dependency_).current_size_ + (from->public_dependency_).current_size_;
    memcpy((void *)((long)iVar1 * 4 + (long)(this->public_dependency_).arena_or_elements_),
           (from->public_dependency_).arena_or_elements_,
           (long)(from->public_dependency_).current_size_ << 2);
  }
  iVar10 = (from->weak_dependency_).current_size_;
  if (iVar10 != 0) {
    iVar1 = (this->weak_dependency_).current_size_;
    RepeatedField<int>::Reserve(&this->weak_dependency_,iVar10 + iVar1);
    (this->weak_dependency_).current_size_ =
         (this->weak_dependency_).current_size_ + (from->weak_dependency_).current_size_;
    memcpy((void *)((long)iVar1 * 4 + (long)(this->weak_dependency_).arena_or_elements_),
           (from->weak_dependency_).arena_or_elements_,
           (long)(from->weak_dependency_).current_size_ << 2);
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar5 = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar11 = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar6 = (this->name_).ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar11,psVar5);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar6);
      }
    }
    if ((uVar2 & 2) != 0) {
      psVar5 = (from->package_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar11 = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar6 = (this->package_).ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->package_,pAVar11,psVar5);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar6);
      }
    }
    if ((uVar2 & 4) != 0) {
      psVar5 = (from->syntax_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      pAVar11 = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar6 = (this->syntax_).ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->syntax_,pAVar11,psVar5);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar6);
      }
    }
    if ((uVar2 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->options_ == (FileOptions *)0x0) {
        pAVar11 = (Arena *)(this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           ).ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
        }
        pFVar8 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(pAVar11);
        this->options_ = pFVar8;
      }
      pFVar8 = (FileOptions *)_FileOptions_default_instance_;
      if (from->options_ != (FileOptions *)0x0) {
        pFVar8 = from->options_;
      }
      FileOptions::MergeFrom(this->options_,pFVar8);
    }
    if ((uVar2 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
        pAVar11 = (Arena *)(this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           ).ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
        }
        pSVar9 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(pAVar11);
        this->source_code_info_ = pSVar9;
      }
      pSVar9 = (SourceCodeInfo *)_SourceCodeInfo_default_instance_;
      if (from->source_code_info_ != (SourceCodeInfo *)0x0) {
        pSVar9 = from->source_code_info_;
      }
      SourceCodeInfo::MergeFrom(this->source_code_info_,pSVar9);
      return;
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_package(from._internal_package());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_syntax(from._internal_syntax());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::FileOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_mutable_source_code_info()->PROTOBUF_NAMESPACE_ID::SourceCodeInfo::MergeFrom(from._internal_source_code_info());
    }
  }
}